

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass_manager.cpp
# Opt level: O2

Status __thiscall spvtools::opt::PassManager::Run(PassManager *this,IRContext *context)

{
  ostream *out;
  Pass *pPVar1;
  Module *this_00;
  bool bVar2;
  int iVar3;
  Status SVar4;
  uint32_t bound;
  undefined4 extraout_var;
  char *tag;
  pointer puVar5;
  unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_> *pass;
  pointer puVar6;
  Status local_f4;
  IRContext *context_local;
  pointer local_e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> binary;
  anon_class_16_2_5d5469c6 print_disassembly;
  spv_position_t null_pos;
  SpirvTools tools;
  ScopedTimer<spvtools::utils::Timer> timer__LINE__;
  string msg;
  _Any_data local_50;
  code *local_40;
  
  print_disassembly.context = &context_local;
  context_local = context;
  print_disassembly.this = this;
  utils::PrintTimerDescription(this->time_report_stream_,true);
  puVar6 = (this->passes_).
           super__Vector_base<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar5 = (this->passes_).
           super__Vector_base<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_f4 = SuccessWithoutChange;
  local_e0 = puVar5;
  do {
    if (puVar6 == puVar5) {
      Run::anon_class_16_2_5d5469c6::operator()
                (&print_disassembly,"; IR after last pass",(Pass *)0x0);
      if (local_f4 == SuccessWithChange) {
        this_00 = (context_local->module_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                  .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
        bound = Module::ComputeIdBound(this_00);
        Module::SetIdBound(this_00,bound);
      }
      std::
      vector<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>
      ::clear(&this->passes_);
      return local_f4;
    }
    Run::anon_class_16_2_5d5469c6::operator()
              (&print_disassembly,"; IR before pass ",
               (puVar6->_M_t).
               super___uniq_ptr_impl<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Pass_*,_std::default_delete<spvtools::opt::Pass>_>
               .super__Head_base<0UL,_spvtools::opt::Pass_*,_false>._M_head_impl);
    out = this->time_report_stream_;
    pPVar1 = (puVar6->_M_t).
             super___uniq_ptr_impl<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>.
             _M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Pass_*,_std::default_delete<spvtools::opt::Pass>_>
             .super__Head_base<0UL,_spvtools::opt::Pass_*,_false>._M_head_impl;
    tag = "";
    if (pPVar1 != (Pass *)0x0) {
      iVar3 = (*pPVar1->_vptr_Pass[2])();
      tag = (char *)CONCAT44(extraout_var,iVar3);
    }
    utils::ScopedTimer<spvtools::utils::Timer>::ScopedTimer(&timer__LINE__,out,tag,true);
    SVar4 = Pass::Run((puVar6->_M_t).
                      super___uniq_ptr_impl<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Pass_*,_std::default_delete<spvtools::opt::Pass>_>
                      .super__Head_base<0UL,_spvtools::opt::Pass_*,_false>._M_head_impl,
                      context_local);
    if (SVar4 == Failure) {
      bVar2 = false;
    }
    else {
      if (SVar4 == SuccessWithChange) {
        local_f4 = SuccessWithChange;
      }
      if (this->validate_after_all_ == true) {
        SpirvTools::SpirvTools(&tools,this->target_env_);
        std::
        function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
        function((function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
                  *)&local_50,&this->consumer_);
        SpirvTools::SetMessageConsumer(&tools,(MessageConsumer *)&local_50);
        if (local_40 != (code *)0x0) {
          (*local_40)(&local_50,&local_50,__destroy_functor);
        }
        binary.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        binary.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        binary.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        Module::ToBinary((context_local->module_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                         .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &binary.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                         true);
        bVar2 = SpirvTools::Validate
                          (&tools,binary.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                           (long)binary.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)binary.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 2,this->val_options_);
        if (!bVar2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&msg,"Validation failed after pass ",(allocator<char> *)&null_pos);
          (*((puVar6->_M_t).
             super___uniq_ptr_impl<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>.
             _M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Pass_*,_std::default_delete<spvtools::opt::Pass>_>
             .super__Head_base<0UL,_spvtools::opt::Pass_*,_false>._M_head_impl)->_vptr_Pass[2])();
          std::__cxx11::string::append((char *)&msg);
          null_pos.line = 0;
          null_pos.column = 0;
          null_pos.index = 0;
          std::
          function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
          operator()(&this->consumer_,SPV_MSG_INTERNAL_ERROR,"",&null_pos,msg._M_dataplus._M_p);
          std::__cxx11::string::_M_dispose();
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&binary.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          SpirvTools::~SpirvTools(&tools);
          bVar2 = false;
          puVar5 = local_e0;
          goto LAB_0017e3c2;
        }
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&binary.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        SpirvTools::~SpirvTools(&tools);
        puVar5 = local_e0;
      }
      pPVar1 = (puVar6->_M_t).
               super___uniq_ptr_impl<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Pass_*,_std::default_delete<spvtools::opt::Pass>_>
               .super__Head_base<0UL,_spvtools::opt::Pass_*,_false>._M_head_impl;
      (puVar6->_M_t).
      super___uniq_ptr_impl<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Pass_*,_std::default_delete<spvtools::opt::Pass>_>.
      super__Head_base<0UL,_spvtools::opt::Pass_*,_false>._M_head_impl = (Pass *)0x0;
      bVar2 = true;
      if (pPVar1 != (Pass *)0x0) {
        (*pPVar1->_vptr_Pass[1])();
      }
    }
LAB_0017e3c2:
    utils::ScopedTimer<spvtools::utils::Timer>::~ScopedTimer(&timer__LINE__);
    puVar6 = puVar6 + 1;
    if (!bVar2) {
      return Failure;
    }
  } while( true );
}

Assistant:

Pass::Status PassManager::Run(IRContext* context) {
  auto status = Pass::Status::SuccessWithoutChange;

  // If print_all_stream_ is not null, prints the disassembly of the module
  // to that stream, with the given preamble and optionally the pass name.
  auto print_disassembly = [&context, this](const char* preamble, Pass* pass) {
    if (print_all_stream_) {
      std::vector<uint32_t> binary;
      context->module()->ToBinary(&binary, false);
      SpirvTools t(target_env_);
      t.SetMessageConsumer(consumer());
      std::string disassembly;
      std::string pass_name = (pass ? pass->name() : "");
      if (!t.Disassemble(binary, &disassembly)) {
        std::string msg = "Disassembly failed before pass ";
        msg += pass_name + "\n";
        spv_position_t null_pos{0, 0, 0};
        consumer()(SPV_MSG_WARNING, "", null_pos, msg.c_str());
        return;
      }
      *print_all_stream_ << preamble << pass_name << "\n"
                         << disassembly << std::endl;
    }
  };

  SPIRV_TIMER_DESCRIPTION(time_report_stream_, /* measure_mem_usage = */ true);
  for (auto& pass : passes_) {
    print_disassembly("; IR before pass ", pass.get());
    SPIRV_TIMER_SCOPED(time_report_stream_, (pass ? pass->name() : ""), true);
    const auto one_status = pass->Run(context);
    if (one_status == Pass::Status::Failure) return one_status;
    if (one_status == Pass::Status::SuccessWithChange) status = one_status;

    if (validate_after_all_) {
      spvtools::SpirvTools tools(target_env_);
      tools.SetMessageConsumer(consumer());
      std::vector<uint32_t> binary;
      context->module()->ToBinary(&binary, true);
      if (!tools.Validate(binary.data(), binary.size(), val_options_)) {
        std::string msg = "Validation failed after pass ";
        msg += pass->name();
        spv_position_t null_pos{0, 0, 0};
        consumer()(SPV_MSG_INTERNAL_ERROR, "", null_pos, msg.c_str());
        return Pass::Status::Failure;
      }
    }

    // Reset the pass to free any memory used by the pass.
    pass.reset(nullptr);
  }
  print_disassembly("; IR after last pass", nullptr);

  // Set the Id bound in the header in case a pass forgot to do so.
  //
  // TODO(dnovillo): This should be unnecessary and automatically maintained by
  // the IRContext.
  if (status == Pass::Status::SuccessWithChange) {
    context->module()->SetIdBound(context->module()->ComputeIdBound());
  }
  passes_.clear();
  return status;
}